

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

string * utilPresolveRuleTypeToString_abi_cxx11_(HighsInt rule_type)

{
  int in_ESI;
  string *in_RDI;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Empty row",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Singleton row",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Redundant row",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else if (in_ESI == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Empty column",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  else if (in_ESI == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Fixed column",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
  }
  else if (in_ESI == 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Dominated col",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (in_ESI == 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Forcing row",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
  }
  else if (in_ESI == 7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Forcing col",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
  }
  else if (in_ESI == 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Free col substitution",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
  }
  else if (in_ESI == 9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Doubleton equation",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else if (in_ESI == 10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Dependent equations",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (in_ESI == 0xb) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Dependent free columns",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (in_ESI == 0xc) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Aggregator",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else if (in_ESI == 0xd) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Parallel rows and columns",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"????",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  return in_RDI;
}

Assistant:

std::string utilPresolveRuleTypeToString(const HighsInt rule_type) {
  if (rule_type == kPresolveRuleEmptyRow) {
    return "Empty row";
  } else if (rule_type == kPresolveRuleSingletonRow) {
    return "Singleton row";
  } else if (rule_type == kPresolveRuleRedundantRow) {
    return "Redundant row";
  } else if (rule_type == kPresolveRuleEmptyCol) {
    return "Empty column";
  } else if (rule_type == kPresolveRuleFixedCol) {
    return "Fixed column";
  } else if (rule_type == kPresolveRuleDominatedCol) {
    return "Dominated col";
  } else if (rule_type == kPresolveRuleForcingRow) {
    return "Forcing row";
  } else if (rule_type == kPresolveRuleForcingCol) {
    return "Forcing col";
  } else if (rule_type == kPresolveRuleFreeColSubstitution) {
    return "Free col substitution";
  } else if (rule_type == kPresolveRuleDoubletonEquation) {
    return "Doubleton equation";
  } else if (rule_type == kPresolveRuleDependentEquations) {
    return "Dependent equations";
  } else if (rule_type == kPresolveRuleDependentFreeCols) {
    return "Dependent free columns";
  } else if (rule_type == kPresolveRuleAggregator) {
    return "Aggregator";
  } else if (rule_type == kPresolveRuleParallelRowsAndCols) {
    return "Parallel rows and columns";
  }
  assert(1 == 0);
  return "????";
}